

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

array<char,_4UL> QLocalePrivate::languageToCode(Language language,LanguageCodeTypes codeTypes)

{
  array<char,_4UL> aVar1;
  uint uVar2;
  _Type acVar3;
  uint uVar4;
  AlphaCode *this;
  
  uVar2 = 0;
  if ((ushort)(language + ~LastLanguage) < 0xfea6) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0x43;
    if (language != C) {
      this = &languageCodeList._M_elems[language].part1;
      if ((((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                  super_QFlagsStorage<QLocale::LanguageCodeType>.i & 1) == 0) ||
         (((ushort)*this & 0x1f) == 0)) {
        if ((((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                    super_QFlagsStorage<QLocale::LanguageCodeType>.i & 2) == 0) ||
           (((ushort)languageCodeList._M_elems[language].part2B & 0x1f) == 0)) {
          if ((((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                      super_QFlagsStorage<QLocale::LanguageCodeType>.i & 4) == 0) ||
             (((ushort)languageCodeList._M_elems[language].part2T & 0x1f) == 0)) {
            uVar4 = 0;
            if (((uint)codeTypes.super_QFlagsStorageHelper<QLocale::LanguageCodeType,_4>.
                       super_QFlagsStorage<QLocale::LanguageCodeType>.i & 8) == 0)
            goto LAB_00307682;
            this = &languageCodeList._M_elems[language].part3;
          }
          else {
            this = &languageCodeList._M_elems[language].part2T;
          }
        }
        else {
          this = &languageCodeList._M_elems[language].part2B;
        }
      }
      aVar1 = AlphaCode::decode(this);
      uVar4 = (uint)aVar1._M_elems & 0xff;
      uVar2 = (uint)aVar1._M_elems & 0xffffff00;
    }
  }
LAB_00307682:
  acVar3 = (_Type)(uVar2 | uVar4);
  aVar1._M_elems[0] = acVar3[0];
  aVar1._M_elems[1] = acVar3[1];
  aVar1._M_elems[2] = acVar3[2];
  aVar1._M_elems[3] = acVar3[3];
  return (array<char,_4UL>)aVar1._M_elems;
}

Assistant:

std::array<char, 4> QLocalePrivate::languageToCode(QLocale::Language language,
                                                   QLocale::LanguageCodeTypes codeTypes)
{
    if (language == QLocale::AnyLanguage || language > QLocale::LastLanguage)
        return {};
    if (language == QLocale::C)
        return {'C'};

    const LanguageCodeEntry &i = languageCodeList[language];

    if (codeTypes.testFlag(QLocale::ISO639Part1) && i.part1.isValid())
        return i.part1.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part2B) && i.part2B.isValid())
        return i.part2B.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part2T) && i.part2T.isValid())
        return i.part2T.decode();

    if (codeTypes.testFlag(QLocale::ISO639Part3))
        return i.part3.decode();

    return {};
}